

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyncExecutor.h
# Opt level: O0

void __thiscall nrg::SyncExecutor::operator()(SyncExecutor *this,Function *fn)

{
  ExceptionType *ex;
  Function *fn_local;
  SyncExecutor *this_local;
  
  std::function<void_()>::operator()(fn);
  return;
}

Assistant:

void operator()(Function fn)
    {
        try {
            fn();
        }
        catch (ExceptionType& ex) {
            onError_(ex);
        }
    }